

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::sse42::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  long lVar2;
  RayQueryContext *k;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  vfloat<4> vVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  vbool<4> vVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  undefined4 uVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  uint uVar16;
  ulong uVar17;
  RayQueryContext *pRVar18;
  size_t sVar19;
  NodeRef root;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar20;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar21;
  NodeRef *pNVar22;
  int iVar23;
  float fVar24;
  float fVar25;
  float fVar45;
  float fVar46;
  vint4 bi;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar47;
  float fVar53;
  float fVar54;
  vint4 ai_3;
  undefined1 auVar48 [16];
  float fVar55;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar56;
  float fVar58;
  float fVar59;
  vint4 ai_1;
  float fVar60;
  undefined1 auVar57 [16];
  float fVar61;
  float fVar64;
  float fVar65;
  vint4 ai;
  float fVar66;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar67;
  uint uVar70;
  vint4 bi_2;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  vint4 ai_2;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  uint uVar80;
  uint uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  vfloat4 a0;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar89;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  vint4 bi_3;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar97;
  float fVar98;
  uint uVar99;
  float fVar103;
  float fVar105;
  vint4 bi_1;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  uint uVar104;
  uint uVar106;
  float fVar107;
  uint uVar108;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar102;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 in_XMM14 [16];
  float fVar114;
  float local_1908;
  float fStack_1904;
  float fStack_1900;
  float fStack_18fc;
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar8 = mm_lookupmask_ps._8_8_;
  uVar7 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar19 = (bvh->root).ptr;
  if (sVar19 != 8) {
    auVar74 = *(undefined1 (*) [16])(ray + 0x80);
    auVar62._0_12_ = ZEXT812(0);
    auVar62._12_4_ = 0;
    auVar48._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar74._0_4_);
    auVar48._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar74._4_4_);
    auVar48._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar74._8_4_);
    auVar48._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar74._12_4_);
    uVar16 = movmskps((int)context,auVar48);
    if (uVar16 != 0) {
      uVar17 = (ulong)(uVar16 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      fVar61 = tray.dir.field_0._0_4_;
      fVar64 = tray.dir.field_0._4_4_;
      fVar65 = tray.dir.field_0._8_4_;
      fVar66 = tray.dir.field_0._12_4_;
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      fVar56 = tray.dir.field_0._16_4_;
      fVar58 = tray.dir.field_0._20_4_;
      fVar59 = tray.dir.field_0._24_4_;
      fVar60 = tray.dir.field_0._28_4_;
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar47 = tray.dir.field_0._32_4_;
      fVar53 = tray.dir.field_0._36_4_;
      fVar54 = tray.dir.field_0._40_4_;
      fVar55 = tray.dir.field_0._44_4_;
      auVar82._0_4_ = fVar56 * fVar56 + fVar47 * fVar47;
      auVar82._4_4_ = fVar58 * fVar58 + fVar53 * fVar53;
      auVar82._8_4_ = fVar59 * fVar59 + fVar54 * fVar54;
      auVar82._12_4_ = fVar60 * fVar60 + fVar55 * fVar55;
      auVar86._0_4_ = fVar61 * fVar61 + auVar82._0_4_;
      auVar86._4_4_ = fVar64 * fVar64 + auVar82._4_4_;
      auVar86._8_4_ = fVar65 * fVar65 + auVar82._8_4_;
      auVar86._12_4_ = fVar66 * fVar66 + auVar82._12_4_;
      auVar82 = rsqrtps(auVar82,auVar86);
      fVar114 = auVar82._0_4_;
      fVar24 = auVar82._4_4_;
      fVar25 = auVar82._8_4_;
      fVar45 = auVar82._12_4_;
      pre.depth_scale.field_0.v[0] =
           fVar114 * fVar114 * auVar86._0_4_ * -0.5 * fVar114 + fVar114 * 1.5;
      pre.depth_scale.field_0.v[1] = fVar24 * fVar24 * auVar86._4_4_ * -0.5 * fVar24 + fVar24 * 1.5;
      pre.depth_scale.field_0.v[2] = fVar25 * fVar25 * auVar86._8_4_ * -0.5 * fVar25 + fVar25 * 1.5;
      pre.depth_scale.field_0.v[3] = fVar45 * fVar45 * auVar86._12_4_ * -0.5 * fVar45 + fVar45 * 1.5
      ;
      while (uVar17 != 0) {
        lVar2 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        auVar86 = insertps(ZEXT416(*(uint *)(ray + lVar2 * 4 + 0x40)),
                           *(undefined4 *)(ray + lVar2 * 4 + 0x50),0x1c);
        auVar86 = insertps(auVar86,*(undefined4 *)(ray + lVar2 * 4 + 0x60),0x28);
        fVar114 = *(float *)((long)pre.ray_space + lVar2 * 4 + -0x10);
        auVar87._0_4_ = auVar86._0_4_ * fVar114;
        auVar87._4_4_ = auVar86._4_4_ * fVar114;
        auVar87._8_4_ = auVar86._8_4_ * fVar114;
        auVar87._12_4_ = auVar86._12_4_ * fVar114;
        uVar5 = CONCAT44(auVar87._4_4_,auVar87._4_4_);
        auVar26._0_8_ = uVar5 ^ 0x8000000080000000;
        auVar26._8_4_ = -auVar87._12_4_;
        auVar26._12_4_ = -auVar87._12_4_;
        auVar86 = blendps(auVar26,auVar62,0xe);
        auVar110._4_4_ = auVar86._0_4_;
        auVar110._0_4_ = auVar87._8_4_;
        auVar110._8_4_ = auVar86._4_4_;
        auVar110._12_4_ = 0;
        auVar109._4_4_ = auVar86._0_4_;
        auVar109._0_4_ = auVar87._8_4_;
        auVar109._8_4_ = auVar86._4_4_;
        auVar109._12_4_ = 0;
        auVar109 = dpps(auVar109 << 0x20,auVar110 << 0x20,0x7f);
        uVar5 = CONCAT44(auVar87._12_4_,auVar87._8_4_);
        auVar90._0_8_ = uVar5 ^ 0x8000000080000000;
        auVar90._8_4_ = -auVar87._8_4_;
        auVar90._12_4_ = -auVar87._12_4_;
        auVar82 = insertps(auVar90,auVar87,0x2a);
        auVar86 = dpps(auVar82,auVar82,0x7f);
        iVar23 = -(uint)(auVar86._0_4_ < auVar109._0_4_);
        auVar27._4_4_ = iVar23;
        auVar27._0_4_ = iVar23;
        auVar27._8_4_ = iVar23;
        auVar27._12_4_ = iVar23;
        auVar86 = blendvps(auVar82,auVar110 << 0x20,auVar27);
        auVar82 = dpps(auVar86,auVar86,0x7f);
        auVar110 = rsqrtss(auVar82,auVar82);
        fVar24 = auVar110._0_4_;
        fVar24 = fVar24 * 1.5 - fVar24 * fVar24 * auVar82._0_4_ * 0.5 * fVar24;
        fVar25 = fVar24 * auVar86._0_4_;
        fVar45 = fVar24 * auVar86._4_4_;
        fVar46 = fVar24 * auVar86._8_4_;
        fVar24 = fVar24 * auVar86._12_4_;
        fVar88 = fVar45 * auVar87._0_4_ - auVar87._4_4_ * fVar25;
        fVar93 = fVar46 * auVar87._4_4_ - auVar87._8_4_ * fVar45;
        fVar95 = fVar25 * auVar87._8_4_ - auVar87._0_4_ * fVar46;
        auVar91._12_4_ = fVar24 * auVar87._12_4_ - auVar87._12_4_ * fVar24;
        auVar91._0_8_ = CONCAT44(fVar95,fVar93);
        auVar91._8_4_ = fVar88;
        auVar100._8_4_ = fVar88;
        auVar100._0_8_ = auVar91._0_8_;
        auVar100._12_4_ = auVar91._12_4_;
        auVar86 = dpps(auVar100,auVar91,0x7f);
        uVar17 = uVar17 & uVar17 - 1;
        auVar82 = rsqrtss(auVar86,auVar86);
        fVar24 = auVar82._0_4_;
        fVar24 = fVar24 * 1.5 - fVar24 * fVar24 * auVar86._0_4_ * 0.5 * fVar24;
        aVar28.m128[1] = fVar24 * fVar88;
        aVar28.m128[0] = fVar46;
        aVar28.m128[2] = auVar87._8_4_ * fVar114;
        aVar28.m128[3] = 0.0;
        pre.ray_space[lVar2].vx.field_0.m128[0] = fVar25;
        pre.ray_space[lVar2].vx.field_0.m128[1] = fVar24 * fVar93;
        pre.ray_space[lVar2].vx.field_0.m128[2] = auVar87._0_4_ * fVar114;
        pre.ray_space[lVar2].vx.field_0.m128[3] = 0.0;
        aVar3.m128[1] = fVar24 * fVar95;
        aVar3.m128[0] = fVar45;
        aVar3.m128[2] = auVar87._4_4_ * fVar114;
        aVar3.m128[3] = 0.0;
        pre.ray_space[lVar2].vy.field_0 = aVar3;
        pre.ray_space[lVar2].vz.field_0 = aVar28;
      }
      tray.org.field_0._0_4_ = (undefined4)*(undefined8 *)ray;
      tray.org.field_0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      tray.org.field_0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      tray.org.field_0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      auVar29._4_4_ = -(uint)(ABS(fVar64) < 1e-18);
      auVar29._0_4_ = -(uint)(ABS(fVar61) < 1e-18);
      auVar29._8_4_ = -(uint)(ABS(fVar65) < 1e-18);
      auVar29._12_4_ = -(uint)(ABS(fVar66) < 1e-18);
      auVar82 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar86 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar30._4_4_ = -(uint)(ABS(fVar58) < 1e-18);
      auVar30._0_4_ = -(uint)(ABS(fVar56) < 1e-18);
      auVar62 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar31._4_4_ = -(uint)(ABS(fVar53) < 1e-18);
      auVar31._0_4_ = -(uint)(ABS(fVar47) < 1e-18);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)blendvps(auVar82,_DAT_01f76a70,auVar29);
      auVar30._8_4_ = -(uint)(ABS(fVar59) < 1e-18);
      auVar30._12_4_ = -(uint)(ABS(fVar60) < 1e-18);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar86,_DAT_01f76a70,auVar30);
      auVar31._8_4_ = -(uint)(ABS(fVar54) < 1e-18);
      auVar31._12_4_ = -(uint)(ABS(fVar55) < 1e-18);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar62,_DAT_01f76a70,auVar31);
      auVar49._0_12_ = ZEXT812(0);
      auVar49._12_4_ = 0;
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar32._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar32._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar32._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar32._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar32);
      auVar33._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar33._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar33._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar33._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar33);
      auVar62 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar49);
      auVar74 = maxps(auVar74,auVar49);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f45a30,auVar62,auVar48);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar74,auVar48);
      auVar74._8_4_ = 0xffffffff;
      auVar74._0_8_ = 0xffffffffffffffff;
      auVar74._12_4_ = 0xffffffff;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar74 ^ auVar48);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar16 = 3;
        pRVar18 = (RayQueryContext *)0x0;
      }
      else {
        pRVar18 = (RayQueryContext *)
                  (CONCAT71((int7)((ulong)context->args >> 8),
                            *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01);
        uVar16 = ((char)pRVar18 == '\0') + 2;
      }
      pNVar22 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_node[1].ptr = sVar19;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar11 = 0x2223f80;
      auVar74 = pmovsxbd(in_XMM14,0x1010101);
      paVar20 = &stack_near[2].field_0;
      aVar102 = _DAT_01f45a30;
LAB_006d3b3c:
      do {
        do {
          root.ptr = pNVar22[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006d41b4;
          pNVar22 = pNVar22 + -1;
          paVar21 = paVar20 + -1;
          local_1908 = paVar21->v[0];
          fStack_1904 = *(float *)((long)paVar20 + -0xc);
          fStack_1900 = *(float *)((long)paVar20 + -8);
          fStack_18fc = *(float *)((long)paVar20 + -4);
          vVar6.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar21->v;
          auVar34._4_4_ = -(uint)(fStack_1904 < tray.tfar.field_0.v[1]);
          auVar34._0_4_ = -(uint)(local_1908 < tray.tfar.field_0.v[0]);
          auVar34._8_4_ = -(uint)(fStack_1900 < tray.tfar.field_0.v[2]);
          auVar34._12_4_ = -(uint)(fStack_18fc < tray.tfar.field_0.v[3]);
          uVar11 = movmskps(uVar11,auVar34);
          paVar20 = paVar21;
        } while (uVar11 == 0);
        uVar17 = (ulong)(byte)uVar11;
        uVar12 = POPCOUNT(uVar11 & 0xff);
        uVar11 = uVar12;
        if (uVar16 < uVar12) {
LAB_006d3b7d:
          vVar9.field_0 = terminated.field_0;
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006d41b4;
              auVar43._4_4_ = -(uint)(fStack_1904 < tray.tfar.field_0.v[1]);
              auVar43._0_4_ = -(uint)(local_1908 < tray.tfar.field_0.v[0]);
              auVar43._8_4_ = -(uint)(fStack_1900 < tray.tfar.field_0.v[2]);
              auVar43._12_4_ = -(uint)(fStack_18fc < tray.tfar.field_0.v[3]);
              uVar11 = movmskps(uVar11,auVar43);
              paVar20 = paVar21;
              if (uVar11 != 0) {
                pRVar18 = (RayQueryContext *)This->leafIntersector;
                valid_o.field_0._0_8_ = uVar7;
                valid_o.field_0._8_8_ = uVar8;
                uVar11 = movmskps(uVar16,(undefined1  [16])terminated.field_0);
                uVar17 = (ulong)(uVar11 ^ 0xf);
                puVar14 = (undefined8 *)
                          ((long)pRVar18 +
                          (ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 0x40 + 0x18);
                puVar15 = puVar14;
                while (uVar17 != 0) {
                  lVar2 = 0;
                  if (uVar17 != 0) {
                    for (; (uVar17 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
                    }
                  }
                  uVar17 = uVar17 & uVar17 - 1;
                  pRVar18 = context;
                  puVar15 = (undefined8 *)
                            (*(code *)*puVar14)(&pre,ray,lVar2,context,
                                                (byte *)(root.ptr & 0xfffffffffffffff0));
                  auVar74 = pmovsxbd(auVar74,0x1010101);
                  aVar102 = _DAT_01f45a30;
                  if ((char)puVar15 != '\0') {
                    valid_o.field_0.i[lVar2] = -1;
                  }
                }
                auVar4._8_8_ = valid_o.field_0._8_8_;
                auVar4._0_8_ = valid_o.field_0._0_8_;
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     ((undefined1  [16])vVar9.field_0 | auVar4);
                uVar11 = movmskps((int)puVar15,(undefined1  [16])terminated.field_0);
                if (uVar11 == 0xf) goto LAB_006d41b4;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                              (undefined1  [16])terminated.field_0);
              }
              goto LAB_006d3b3c;
            }
            uVar17 = root.ptr & 0xfffffffffffffff0;
            local_1908 = aVar102.v[0];
            fStack_1904 = aVar102.v[1];
            fStack_1900 = aVar102.v[2];
            fStack_18fc = aVar102.v[3];
            sVar19 = 8;
            for (pRVar18 = (RayQueryContext *)&DAT_0000001c;
                (pRVar18 != (RayQueryContext *)&DAT_00000020 &&
                (sVar1 = *(size_t *)((uVar17 - 0xe0) + (long)pRVar18 * 8), sVar1 != 8));
                pRVar18 = (RayQueryContext *)((long)&pRVar18->scene + 1)) {
              if ((root.ptr & 7) == 0) {
                fVar47 = *(float *)((root.ptr - 0x50) + (long)pRVar18 * 4);
                fVar53 = *(float *)((root.ptr - 0x40) + (long)pRVar18 * 4);
                fVar54 = *(float *)((root.ptr - 0x30) + (long)pRVar18 * 4);
                fVar55 = *(float *)((root.ptr - 0x20) + (long)pRVar18 * 4);
                auVar50._0_8_ =
                     CONCAT44((fVar47 - (float)tray.org.field_0._4_4_) *
                              (float)tray.rdir.field_0._4_4_,
                              (fVar47 - (float)tray.org.field_0._0_4_) *
                              (float)tray.rdir.field_0._0_4_);
                auVar50._8_4_ =
                     (fVar47 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
                auVar50._12_4_ =
                     (fVar47 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
                auVar35._0_8_ =
                     CONCAT44((fVar54 - (float)tray.org.field_0._20_4_) *
                              (float)tray.rdir.field_0._20_4_,
                              (fVar54 - (float)tray.org.field_0._16_4_) *
                              (float)tray.rdir.field_0._16_4_);
                auVar35._8_4_ =
                     (fVar54 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
                auVar35._12_4_ =
                     (fVar54 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
                fVar47 = *(float *)((root.ptr - 0x10) + (long)pRVar18 * 4);
                auVar75._0_8_ =
                     CONCAT44((fVar47 - (float)tray.org.field_0._36_4_) *
                              (float)tray.rdir.field_0._36_4_,
                              (fVar47 - (float)tray.org.field_0._32_4_) *
                              (float)tray.rdir.field_0._32_4_);
                auVar75._8_4_ =
                     (fVar47 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
                auVar75._12_4_ =
                     (fVar47 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
                auVar57._0_4_ =
                     (fVar53 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
                auVar57._4_4_ =
                     (fVar53 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
                auVar57._8_4_ =
                     (fVar53 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
                auVar57._12_4_ =
                     (fVar53 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
                auVar63._0_4_ =
                     (fVar55 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_;
                auVar63._4_4_ =
                     (fVar55 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_;
                auVar63._8_4_ =
                     (fVar55 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
                auVar63._12_4_ =
                     (fVar55 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
                fVar47 = *(float *)(root.ptr + (long)pRVar18 * 4);
                auVar83._0_4_ =
                     (fVar47 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
                auVar83._4_4_ =
                     (fVar47 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
                auVar83._8_4_ =
                     (fVar47 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
                auVar83._12_4_ =
                     (fVar47 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
                auVar68._8_4_ = auVar50._8_4_;
                auVar68._0_8_ = auVar50._0_8_;
                auVar68._12_4_ = auVar50._12_4_;
                auVar62 = minps(auVar68,auVar57);
                auVar84._8_4_ = auVar35._8_4_;
                auVar84._0_8_ = auVar35._0_8_;
                auVar84._12_4_ = auVar35._12_4_;
                auVar86 = minps(auVar84,auVar63);
                auVar62 = maxps(auVar62,auVar86);
                auVar85._8_4_ = auVar75._8_4_;
                auVar85._0_8_ = auVar75._0_8_;
                auVar85._12_4_ = auVar75._12_4_;
                auVar86 = minps(auVar85,auVar83);
                auVar62 = maxps(auVar62,auVar86);
                auVar69._0_8_ = CONCAT44(auVar62._4_4_ * 0.99999964,auVar62._0_4_ * 0.99999964);
                auVar69._8_4_ = auVar62._8_4_ * 0.99999964;
                auVar69._12_4_ = auVar62._12_4_ * 0.99999964;
                auVar86 = maxps(auVar50,auVar57);
                auVar62 = maxps(auVar35,auVar63);
                auVar62 = minps(auVar86,auVar62);
                auVar86 = maxps(auVar75,auVar83);
                auVar86 = minps(auVar62,auVar86);
                auVar36._8_4_ = auVar69._8_4_;
                auVar36._0_8_ = auVar69._0_8_;
                auVar36._12_4_ = auVar69._12_4_;
                auVar62 = maxps(auVar36,(undefined1  [16])tray.tnear.field_0);
                auVar51._0_4_ = auVar86._0_4_ * 1.0000004;
                auVar51._4_4_ = auVar86._4_4_ * 1.0000004;
                auVar51._8_4_ = auVar86._8_4_ * 1.0000004;
                auVar51._12_4_ = auVar86._12_4_ * 1.0000004;
                auVar86 = minps(auVar51,(undefined1  [16])tray.tfar.field_0);
                auVar37._4_4_ = -(uint)(auVar62._4_4_ <= auVar86._4_4_);
                auVar37._0_4_ = -(uint)(auVar62._0_4_ <= auVar86._0_4_);
                auVar37._8_4_ = -(uint)(auVar62._8_4_ <= auVar86._8_4_);
                auVar37._12_4_ = -(uint)(auVar62._12_4_ <= auVar86._12_4_);
              }
              else {
                fVar47 = *(float *)((uVar17 - 0x50) + (long)pRVar18 * 4);
                fVar53 = *(float *)((uVar17 - 0x40) + (long)pRVar18 * 4);
                fVar54 = *(float *)((uVar17 - 0x30) + (long)pRVar18 * 4);
                fVar55 = *(float *)((uVar17 - 0x20) + (long)pRVar18 * 4);
                fVar56 = *(float *)((uVar17 - 0x10) + (long)pRVar18 * 4);
                fVar58 = *(float *)(uVar17 + (long)pRVar18 * 4);
                fVar59 = *(float *)(uVar17 + 0x10 + (long)pRVar18 * 4);
                fVar60 = *(float *)(uVar17 + 0x20 + (long)pRVar18 * 4);
                fVar61 = *(float *)(uVar17 + 0x30 + (long)pRVar18 * 4);
                auVar92._0_4_ =
                     (float)tray.dir.field_0._16_4_ * fVar58 +
                     (float)tray.dir.field_0._32_4_ * fVar61;
                auVar92._4_4_ =
                     (float)tray.dir.field_0._20_4_ * fVar58 +
                     (float)tray.dir.field_0._36_4_ * fVar61;
                auVar92._8_4_ =
                     (float)tray.dir.field_0._24_4_ * fVar58 +
                     (float)tray.dir.field_0._40_4_ * fVar61;
                auVar92._12_4_ =
                     (float)tray.dir.field_0._28_4_ * fVar58 +
                     (float)tray.dir.field_0._44_4_ * fVar61;
                auVar101._0_4_ =
                     fVar47 * (float)tray.dir.field_0._0_4_ +
                     fVar55 * (float)tray.dir.field_0._16_4_ +
                     fVar59 * (float)tray.dir.field_0._32_4_;
                auVar101._4_4_ =
                     fVar47 * (float)tray.dir.field_0._4_4_ +
                     fVar55 * (float)tray.dir.field_0._20_4_ +
                     fVar59 * (float)tray.dir.field_0._36_4_;
                auVar101._8_4_ =
                     fVar47 * (float)tray.dir.field_0._8_4_ +
                     fVar55 * (float)tray.dir.field_0._24_4_ +
                     fVar59 * (float)tray.dir.field_0._40_4_;
                auVar101._12_4_ =
                     fVar47 * (float)tray.dir.field_0._12_4_ +
                     fVar55 * (float)tray.dir.field_0._28_4_ +
                     fVar59 * (float)tray.dir.field_0._44_4_;
                auVar112._0_4_ =
                     fVar53 * (float)tray.dir.field_0._0_4_ +
                     fVar56 * (float)tray.dir.field_0._16_4_ +
                     fVar60 * (float)tray.dir.field_0._32_4_;
                auVar112._4_4_ =
                     fVar53 * (float)tray.dir.field_0._4_4_ +
                     fVar56 * (float)tray.dir.field_0._20_4_ +
                     fVar60 * (float)tray.dir.field_0._36_4_;
                auVar112._8_4_ =
                     fVar53 * (float)tray.dir.field_0._8_4_ +
                     fVar56 * (float)tray.dir.field_0._24_4_ +
                     fVar60 * (float)tray.dir.field_0._40_4_;
                auVar112._12_4_ =
                     fVar53 * (float)tray.dir.field_0._12_4_ +
                     fVar56 * (float)tray.dir.field_0._28_4_ +
                     fVar60 * (float)tray.dir.field_0._44_4_;
                fVar64 = (float)DAT_01f4bd50;
                fVar65 = DAT_01f4bd50._4_4_;
                fVar66 = DAT_01f4bd50._8_4_;
                fVar114 = DAT_01f4bd50._12_4_;
                auVar39._4_4_ = -(uint)(ABS(auVar101._4_4_) < fVar65);
                auVar39._0_4_ = -(uint)(ABS(auVar101._0_4_) < fVar64);
                auVar39._8_4_ = -(uint)(ABS(auVar101._8_4_) < fVar66);
                auVar39._12_4_ = -(uint)(ABS(auVar101._12_4_) < fVar114);
                auVar62 = blendvps(auVar101,_DAT_01f4bd50,auVar39);
                auVar40._4_4_ = -(uint)(ABS(auVar112._4_4_) < fVar65);
                auVar40._0_4_ = -(uint)(ABS(auVar112._0_4_) < fVar64);
                auVar40._8_4_ = -(uint)(ABS(auVar112._8_4_) < fVar66);
                auVar40._12_4_ = -(uint)(ABS(auVar112._12_4_) < fVar114);
                auVar82 = blendvps(auVar112,_DAT_01f4bd50,auVar40);
                auVar111._0_4_ = (float)tray.dir.field_0._0_4_ * fVar54 + auVar92._0_4_;
                auVar111._4_4_ = (float)tray.dir.field_0._4_4_ * fVar54 + auVar92._4_4_;
                auVar111._8_4_ = (float)tray.dir.field_0._8_4_ * fVar54 + auVar92._8_4_;
                auVar111._12_4_ = (float)tray.dir.field_0._12_4_ * fVar54 + auVar92._12_4_;
                auVar41._4_4_ = -(uint)(ABS(auVar111._4_4_) < fVar65);
                auVar41._0_4_ = -(uint)(ABS(auVar111._0_4_) < fVar64);
                auVar41._8_4_ = -(uint)(ABS(auVar111._8_4_) < fVar66);
                auVar41._12_4_ = -(uint)(ABS(auVar111._12_4_) < fVar114);
                auVar86 = blendvps(auVar111,_DAT_01f4bd50,auVar41);
                auVar74 = rcpps(auVar92,auVar62);
                fVar114 = auVar74._0_4_;
                fVar24 = auVar74._4_4_;
                fVar25 = auVar74._8_4_;
                fVar45 = auVar74._12_4_;
                fVar66 = (float)DAT_01f46a60;
                fVar46 = DAT_01f46a60._4_4_;
                fVar88 = DAT_01f46a60._12_4_;
                fVar65 = DAT_01f46a60._8_4_;
                fVar114 = (fVar66 - auVar62._0_4_ * fVar114) * fVar114 + fVar114;
                fVar24 = (fVar46 - auVar62._4_4_ * fVar24) * fVar24 + fVar24;
                fVar25 = (fVar65 - auVar62._8_4_ * fVar25) * fVar25 + fVar25;
                fVar45 = (fVar88 - auVar62._12_4_ * fVar45) * fVar45 + fVar45;
                auVar74 = rcpps(auVar74,auVar82);
                fVar98 = auVar74._0_4_;
                auVar113._0_4_ = auVar82._0_4_ * fVar98;
                fVar103 = auVar74._4_4_;
                auVar113._4_4_ = auVar82._4_4_ * fVar103;
                fVar105 = auVar74._8_4_;
                auVar113._8_4_ = auVar82._8_4_ * fVar105;
                fVar107 = auVar74._12_4_;
                auVar113._12_4_ = auVar82._12_4_ * fVar107;
                fVar98 = (fVar66 - auVar113._0_4_) * fVar98 + fVar98;
                fVar103 = (fVar46 - auVar113._4_4_) * fVar103 + fVar103;
                fVar105 = (fVar65 - auVar113._8_4_) * fVar105 + fVar105;
                fVar107 = (fVar88 - auVar113._12_4_) * fVar107 + fVar107;
                auVar74 = rcpps(auVar113,auVar86);
                fVar89 = auVar74._0_4_;
                fVar94 = auVar74._4_4_;
                fVar96 = auVar74._8_4_;
                fVar97 = auVar74._12_4_;
                auVar74 = pmovsxbd(_DAT_01f46a60,0x1010101);
                fVar64 = *(float *)(uVar17 + 0x40 + (long)pRVar18 * 4);
                fVar89 = (fVar66 - auVar86._0_4_ * fVar89) * fVar89 + fVar89;
                fVar94 = (fVar46 - auVar86._4_4_ * fVar94) * fVar94 + fVar94;
                fVar96 = (fVar65 - auVar86._8_4_ * fVar96) * fVar96 + fVar96;
                fVar97 = (fVar88 - auVar86._12_4_ * fVar97) * fVar97 + fVar97;
                fVar65 = *(float *)(uVar17 + 0x50 + (long)pRVar18 * 4);
                fVar66 = *(float *)(uVar17 + 0x60 + (long)pRVar18 * 4);
                fVar88 = (fVar47 * (float)tray.org.field_0._0_4_ +
                         fVar55 * (float)tray.org.field_0._16_4_ +
                         fVar59 * (float)tray.org.field_0._32_4_ + fVar64) * -fVar114;
                fVar93 = (fVar47 * (float)tray.org.field_0._4_4_ +
                         fVar55 * (float)tray.org.field_0._20_4_ +
                         fVar59 * (float)tray.org.field_0._36_4_ + fVar64) * -fVar24;
                fVar95 = (fVar47 * (float)tray.org.field_0._8_4_ +
                         fVar55 * (float)tray.org.field_0._24_4_ +
                         fVar59 * (float)tray.org.field_0._40_4_ + fVar64) * -fVar25;
                fVar67 = (fVar47 * (float)tray.org.field_0._12_4_ +
                         fVar55 * (float)tray.org.field_0._28_4_ +
                         fVar59 * (float)tray.org.field_0._44_4_ + fVar64) * -fVar45;
                fVar59 = (fVar53 * (float)tray.org.field_0._0_4_ +
                         fVar56 * (float)tray.org.field_0._16_4_ +
                         fVar60 * (float)tray.org.field_0._32_4_ + fVar65) * -fVar98;
                fVar64 = (fVar53 * (float)tray.org.field_0._4_4_ +
                         fVar56 * (float)tray.org.field_0._20_4_ +
                         fVar60 * (float)tray.org.field_0._36_4_ + fVar65) * -fVar103;
                fVar46 = (fVar53 * (float)tray.org.field_0._8_4_ +
                         fVar56 * (float)tray.org.field_0._24_4_ +
                         fVar60 * (float)tray.org.field_0._40_4_ + fVar65) * -fVar105;
                fVar56 = (fVar53 * (float)tray.org.field_0._12_4_ +
                         fVar56 * (float)tray.org.field_0._28_4_ +
                         fVar60 * (float)tray.org.field_0._44_4_ + fVar65) * -fVar107;
                fVar47 = (fVar54 * (float)tray.org.field_0._0_4_ +
                         fVar58 * (float)tray.org.field_0._16_4_ +
                         fVar61 * (float)tray.org.field_0._32_4_ + fVar66) * -fVar89;
                fVar53 = (fVar54 * (float)tray.org.field_0._4_4_ +
                         fVar58 * (float)tray.org.field_0._20_4_ +
                         fVar61 * (float)tray.org.field_0._36_4_ + fVar66) * -fVar94;
                fVar55 = (fVar54 * (float)tray.org.field_0._8_4_ +
                         fVar58 * (float)tray.org.field_0._24_4_ +
                         fVar61 * (float)tray.org.field_0._40_4_ + fVar66) * -fVar96;
                fVar54 = (fVar54 * (float)tray.org.field_0._12_4_ +
                         fVar58 * (float)tray.org.field_0._28_4_ +
                         fVar61 * (float)tray.org.field_0._44_4_ + fVar66) * -fVar97;
                fVar114 = fVar114 + fVar88;
                fVar24 = fVar24 + fVar93;
                fVar25 = fVar25 + fVar95;
                fVar45 = fVar45 + fVar67;
                fVar98 = fVar98 + fVar59;
                fVar103 = fVar103 + fVar64;
                fVar105 = fVar105 + fVar46;
                fVar107 = fVar107 + fVar56;
                fVar89 = fVar89 + fVar47;
                fVar94 = fVar94 + fVar53;
                fVar96 = fVar96 + fVar55;
                fVar97 = fVar97 + fVar54;
                uVar11 = (uint)((int)fVar114 < (int)fVar88) * (int)fVar114 |
                         (uint)((int)fVar114 >= (int)fVar88) * (int)fVar88;
                uVar12 = (uint)((int)fVar24 < (int)fVar93) * (int)fVar24 |
                         (uint)((int)fVar24 >= (int)fVar93) * (int)fVar93;
                uVar70 = (uint)((int)fVar25 < (int)fVar95) * (int)fVar25 |
                         (uint)((int)fVar25 >= (int)fVar95) * (int)fVar95;
                uVar71 = (uint)((int)fVar45 < (int)fVar67) * (int)fVar45 |
                         (uint)((int)fVar45 >= (int)fVar67) * (int)fVar67;
                uVar72 = (uint)((int)fVar98 < (int)fVar59) * (int)fVar98 |
                         (uint)((int)fVar98 >= (int)fVar59) * (int)fVar59;
                uVar76 = (uint)((int)fVar103 < (int)fVar64) * (int)fVar103 |
                         (uint)((int)fVar103 >= (int)fVar64) * (int)fVar64;
                uVar78 = (uint)((int)fVar105 < (int)fVar46) * (int)fVar105 |
                         (uint)((int)fVar105 >= (int)fVar46) * (int)fVar46;
                uVar80 = (uint)((int)fVar107 < (int)fVar56) * (int)fVar107 |
                         (uint)((int)fVar107 >= (int)fVar56) * (int)fVar56;
                uVar73 = ((int)uVar72 < (int)uVar11) * uVar11 |
                         ((int)uVar72 >= (int)uVar11) * uVar72;
                uVar77 = ((int)uVar76 < (int)uVar12) * uVar12 |
                         ((int)uVar76 >= (int)uVar12) * uVar76;
                uVar79 = ((int)uVar78 < (int)uVar70) * uVar70 |
                         ((int)uVar78 >= (int)uVar70) * uVar78;
                uVar81 = ((int)uVar80 < (int)uVar71) * uVar71 |
                         ((int)uVar80 >= (int)uVar71) * uVar80;
                uVar72 = (uint)((int)fVar89 < (int)fVar47) * (int)fVar89 |
                         (uint)((int)fVar89 >= (int)fVar47) * (int)fVar47;
                uVar76 = (uint)((int)fVar94 < (int)fVar53) * (int)fVar94 |
                         (uint)((int)fVar94 >= (int)fVar53) * (int)fVar53;
                uVar78 = (uint)((int)fVar96 < (int)fVar55) * (int)fVar96 |
                         (uint)((int)fVar96 >= (int)fVar55) * (int)fVar55;
                uVar80 = (uint)((int)fVar97 < (int)fVar54) * (int)fVar97 |
                         (uint)((int)fVar97 >= (int)fVar54) * (int)fVar54;
                uVar11 = (uint)((int)fVar114 < (int)fVar88) * (int)fVar88 |
                         (uint)((int)fVar114 >= (int)fVar88) * (int)fVar114;
                uVar12 = (uint)((int)fVar24 < (int)fVar93) * (int)fVar93 |
                         (uint)((int)fVar24 >= (int)fVar93) * (int)fVar24;
                uVar70 = (uint)((int)fVar25 < (int)fVar95) * (int)fVar95 |
                         (uint)((int)fVar25 >= (int)fVar95) * (int)fVar25;
                uVar71 = (uint)((int)fVar45 < (int)fVar67) * (int)fVar67 |
                         (uint)((int)fVar45 >= (int)fVar67) * (int)fVar45;
                uVar99 = (uint)((int)fVar98 < (int)fVar59) * (int)fVar59 |
                         (uint)((int)fVar98 >= (int)fVar59) * (int)fVar98;
                uVar104 = (uint)((int)fVar103 < (int)fVar64) * (int)fVar64 |
                          (uint)((int)fVar103 >= (int)fVar64) * (int)fVar103;
                uVar106 = (uint)((int)fVar105 < (int)fVar46) * (int)fVar46 |
                          (uint)((int)fVar105 >= (int)fVar46) * (int)fVar105;
                uVar108 = (uint)((int)fVar107 < (int)fVar56) * (int)fVar56 |
                          (uint)((int)fVar107 >= (int)fVar56) * (int)fVar107;
                uVar99 = ((int)uVar11 < (int)uVar99) * uVar11 |
                         ((int)uVar11 >= (int)uVar99) * uVar99;
                uVar104 = ((int)uVar12 < (int)uVar104) * uVar12 |
                          ((int)uVar12 >= (int)uVar104) * uVar104;
                uVar106 = ((int)uVar70 < (int)uVar106) * uVar70 |
                          ((int)uVar70 >= (int)uVar106) * uVar106;
                uVar108 = ((int)uVar71 < (int)uVar108) * uVar71 |
                          ((int)uVar71 >= (int)uVar108) * uVar108;
                uVar11 = (uint)((int)fVar89 < (int)fVar47) * (int)fVar47 |
                         (uint)((int)fVar89 >= (int)fVar47) * (int)fVar89;
                uVar12 = (uint)((int)fVar94 < (int)fVar53) * (int)fVar53 |
                         (uint)((int)fVar94 >= (int)fVar53) * (int)fVar94;
                uVar70 = (uint)((int)fVar96 < (int)fVar55) * (int)fVar55 |
                         (uint)((int)fVar96 >= (int)fVar55) * (int)fVar96;
                uVar71 = (uint)((int)fVar97 < (int)fVar54) * (int)fVar54 |
                         (uint)((int)fVar97 >= (int)fVar54) * (int)fVar97;
                auVar69._0_4_ =
                     (float)(((int)uVar72 < (int)uVar73) * uVar73 |
                            ((int)uVar72 >= (int)uVar73) * uVar72) * 0.99999964;
                auVar69._4_4_ =
                     (float)(((int)uVar76 < (int)uVar77) * uVar77 |
                            ((int)uVar76 >= (int)uVar77) * uVar76) * 0.99999964;
                auVar69._8_4_ =
                     (float)(((int)uVar78 < (int)uVar79) * uVar79 |
                            ((int)uVar78 >= (int)uVar79) * uVar78) * 0.99999964;
                auVar69._12_4_ =
                     (float)(((int)uVar80 < (int)uVar81) * uVar81 |
                            ((int)uVar80 >= (int)uVar81) * uVar80) * 0.99999964;
                fVar47 = (float)(((int)uVar99 < (int)uVar11) * uVar99 |
                                ((int)uVar99 >= (int)uVar11) * uVar11) * 1.0000004;
                fVar53 = (float)(((int)uVar104 < (int)uVar12) * uVar104 |
                                ((int)uVar104 >= (int)uVar12) * uVar12) * 1.0000004;
                fVar54 = (float)(((int)uVar106 < (int)uVar70) * uVar106 |
                                ((int)uVar106 >= (int)uVar70) * uVar70) * 1.0000004;
                fVar55 = (float)(((int)uVar108 < (int)uVar71) * uVar108 |
                                ((int)uVar108 >= (int)uVar71) * uVar71) * 1.0000004;
                auVar37._4_4_ =
                     -(uint)((float)((uint)(tray.tnear.field_0.i[1] < (int)auVar69._4_4_) *
                                     (int)auVar69._4_4_ |
                                    (uint)(tray.tnear.field_0.i[1] >= (int)auVar69._4_4_) *
                                    tray.tnear.field_0.i[1]) <=
                            (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar53) *
                                    tray.tfar.field_0.i[1] |
                                   (uint)(tray.tfar.field_0.i[1] >= (int)fVar53) * (int)fVar53));
                auVar37._0_4_ =
                     -(uint)((float)((uint)(tray.tnear.field_0.i[0] < (int)auVar69._0_4_) *
                                     (int)auVar69._0_4_ |
                                    (uint)(tray.tnear.field_0.i[0] >= (int)auVar69._0_4_) *
                                    tray.tnear.field_0.i[0]) <=
                            (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar47) *
                                    tray.tfar.field_0.i[0] |
                                   (uint)(tray.tfar.field_0.i[0] >= (int)fVar47) * (int)fVar47));
                auVar37._8_4_ =
                     -(uint)((float)((uint)(tray.tnear.field_0.i[2] < (int)auVar69._8_4_) *
                                     (int)auVar69._8_4_ |
                                    (uint)(tray.tnear.field_0.i[2] >= (int)auVar69._8_4_) *
                                    tray.tnear.field_0.i[2]) <=
                            (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar54) *
                                    tray.tfar.field_0.i[2] |
                                   (uint)(tray.tfar.field_0.i[2] >= (int)fVar54) * (int)fVar54));
                auVar37._12_4_ =
                     -(uint)((float)((uint)(tray.tnear.field_0.i[3] < (int)auVar69._12_4_) *
                                     (int)auVar69._12_4_ |
                                    (uint)(tray.tnear.field_0.i[3] >= (int)auVar69._12_4_) *
                                    tray.tnear.field_0.i[3]) <=
                            (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar55) *
                                    tray.tfar.field_0.i[3] |
                                   (uint)(tray.tfar.field_0.i[3] >= (int)fVar55) * (int)fVar55));
                aVar102 = _DAT_01f45a30;
              }
              if ((auVar74 & auVar37) == (undefined1  [16])0x0) {
                auVar52._4_4_ = fStack_1904;
                auVar52._0_4_ = local_1908;
                auVar52._8_4_ = fStack_1900;
                auVar52._12_4_ = fStack_18fc;
                sVar1 = sVar19;
              }
              else {
                auVar38._0_4_ = auVar37._0_4_ << 0x1f;
                auVar38._4_4_ = auVar37._4_4_ << 0x1f;
                auVar38._8_4_ = auVar37._8_4_ << 0x1f;
                auVar38._12_4_ = auVar37._12_4_ << 0x1f;
                auVar52 = blendvps((undefined1  [16])aVar102,auVar69,auVar38);
                if (sVar19 != 8) {
                  pNVar22->ptr = sVar19;
                  pNVar22 = pNVar22 + 1;
                  paVar21->v[0] = local_1908;
                  paVar21->v[1] = fStack_1904;
                  paVar21->v[2] = fStack_1900;
                  paVar21->v[3] = fStack_18fc;
                  paVar21 = paVar21 + 1;
                }
              }
              sVar19 = sVar1;
              local_1908 = auVar52._0_4_;
              fStack_1904 = auVar52._4_4_;
              fStack_1900 = auVar52._8_4_;
              fStack_18fc = auVar52._12_4_;
            }
            if (sVar19 == 8) goto LAB_006d3fd4;
            auVar42._4_4_ = -(uint)(fStack_1904 < tray.tfar.field_0.v[1]);
            auVar42._0_4_ = -(uint)(local_1908 < tray.tfar.field_0.v[0]);
            auVar42._8_4_ = -(uint)(fStack_1900 < tray.tfar.field_0.v[2]);
            auVar42._12_4_ = -(uint)(fStack_18fc < tray.tfar.field_0.v[3]);
            uVar13 = movmskps((int)uVar17,auVar42);
            uVar11 = POPCOUNT(uVar13);
            root.ptr = sVar19;
          } while ((byte)uVar16 < (byte)uVar11);
          pNVar22->ptr = sVar19;
          pNVar22 = pNVar22 + 1;
          paVar21->v[0] = local_1908;
          paVar21->v[1] = fStack_1904;
          paVar21->v[2] = fStack_1900;
          paVar21->v[3] = fStack_18fc;
          paVar21 = paVar21 + 1;
LAB_006d3fd4:
          uVar11 = 4;
        }
        else {
          while (uVar17 != 0) {
            k = (RayQueryContext *)0x0;
            if (uVar17 != 0) {
              for (; (uVar17 >> (long)k & 1) == 0; k = (RayQueryContext *)((long)&k->scene + 1)) {
              }
            }
            uVar17 = uVar17 & uVar17 - 1;
            pRVar18 = k;
            bVar10 = occluded1(This,bvh,root,(size_t)k,&pre,ray,&tray,context);
            if (bVar10) {
              terminated.field_0.i[(long)k] = -1;
            }
          }
          uVar70 = movmskps((int)pRVar18,(undefined1  [16])terminated.field_0);
          pRVar18 = (RayQueryContext *)(ulong)uVar70;
          uVar11 = 3;
          auVar74 = pmovsxbd(auVar74,0x1010101);
          local_1908 = vVar6.field_0._0_4_;
          fStack_1904 = vVar6.field_0._4_4_;
          fStack_1900 = vVar6.field_0._8_4_;
          fStack_18fc = vVar6.field_0._12_4_;
          if (uVar70 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                          (undefined1  [16])terminated.field_0);
            uVar11 = 2;
          }
          aVar102 = _DAT_01f45a30;
          if (uVar16 < uVar12) goto LAB_006d3b7d;
        }
        paVar20 = paVar21;
      } while (uVar11 != 3);
LAB_006d41b4:
      auVar44._0_4_ = auVar48._0_4_ & terminated.field_0.i[0];
      auVar44._4_4_ = auVar48._4_4_ & terminated.field_0.i[1];
      auVar44._8_4_ = auVar48._8_4_ & terminated.field_0.i[2];
      auVar44._12_4_ = auVar48._12_4_ & terminated.field_0.i[3];
      auVar74 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar44);
      *(undefined1 (*) [16])(ray + 0x80) = auVar74;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }